

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_ManSimBitPackOne
              (int nWords,Vec_Wrd_t *vSimsIn,Vec_Wrd_t *vSimsCare,int iPat,int *pLits,int nLits)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  word *pwVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_6c;
  ulong local_50;
  
  uVar10 = 0;
  uVar6 = 0;
  if (0 < nLits) {
    uVar6 = (ulong)(uint)nLits;
  }
  uVar5 = 0;
  if (0 < iPat) {
    uVar5 = iPat;
  }
  while (local_6c = (uint)uVar10, local_6c != uVar5) {
    uVar10 = uVar10 >> 6;
    local_50 = (ulong)(local_6c & 0x3f);
    uVar12 = 1L << (sbyte)(local_6c & 0x3f);
    for (uVar11 = 0; uVar9 = uVar6, uVar6 != uVar11; uVar11 = uVar11 + 1) {
      iVar3 = Abc_Lit2Var(pLits[uVar11]);
      pwVar7 = Vec_WrdEntryP(vSimsIn,iVar3 * nWords);
      pwVar8 = Vec_WrdEntryP(vSimsCare,iVar3 * nWords);
      if (((pwVar8[uVar10] & uVar12) != 0) &&
         (uVar2 = pwVar7[uVar10], uVar4 = Abc_LitIsCompl(pLits[uVar11]), uVar9 = uVar11,
         ((uVar2 >> local_50 & 1) != 0) == uVar4)) break;
    }
    if ((int)uVar9 == nLits) goto LAB_0063c012;
    uVar10 = (ulong)(local_6c + 1);
  }
  local_50 = (ulong)(uVar5 & 0x3f);
  uVar12 = 1L << (sbyte)(uVar5 & 0x3f);
  uVar10 = (ulong)(uVar5 >> 6);
  local_6c = uVar5;
LAB_0063c012:
  uVar11 = 0;
  do {
    if (uVar6 == uVar11) {
      return (int)(local_6c == iPat);
    }
    iVar3 = Abc_Lit2Var(pLits[uVar11]);
    pwVar7 = Vec_WrdEntryP(vSimsIn,iVar3 * nWords);
    pwVar8 = Vec_WrdEntryP(vSimsCare,iVar3 * nWords);
    if (((pwVar8[uVar10] & uVar12) == 0) &&
       (uVar9 = pwVar7[uVar10], uVar5 = Abc_LitIsCompl(pLits[uVar11]),
       ((uVar9 >> local_50 & 1) != 0) == uVar5)) {
      pwVar7[uVar10] = pwVar7[uVar10] ^ uVar12;
    }
    uVar9 = (ulong)(uint)((int)uVar10 * 8);
    puVar1 = (ulong *)((long)pwVar8 + uVar9);
    *puVar1 = *puVar1 | uVar12;
    uVar9 = *(ulong *)((long)pwVar7 + uVar9);
    uVar5 = Abc_LitIsCompl(pLits[uVar11]);
    uVar11 = uVar11 + 1;
  } while (((uVar9 >> local_50 & 1) != 0) != uVar5);
  __assert_fail("Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k]))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x130,"int Gia_ManSimBitPackOne(int, Vec_Wrd_t *, Vec_Wrd_t *, int, int *, int)");
}

Assistant:

int Gia_ManSimBitPackOne( int nWords, Vec_Wrd_t * vSimsIn, Vec_Wrd_t * vSimsCare, int iPat, int * pLits, int nLits )
{
    word * pSimsI, * pSimsC; int i, k;
    for ( i = 0; i < iPat; i++ )
    {
        for ( k = 0; k < nLits; k++ )
        {
            int iVar = Abc_Lit2Var( pLits[k] );
            pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
            pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
            if ( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k])) )
                break;
        }
        if ( k == nLits )
            break;
    }
    for ( k = 0; k < nLits; k++ )
    {
        int iVar = Abc_Lit2Var( pLits[k] );
        pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
        pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
        if ( !Abc_TtGetBit(pSimsC, i) && Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k]) )
            Abc_TtXorBit( pSimsI, i );
        Abc_TtSetBit( pSimsC, i );
        assert( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k])) );
    }
    return (int)(i == iPat);
}